

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  uint uVar13;
  
  fVar2 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86[-3]);
  if (fVar2 != 1.0) {
    if (bottom_top_blob->elempack != 4) {
      iVar9 = Dropout::forward_inplace
                        ((Dropout *)
                         ((long)&this->_vptr_Dropout_x86 + (long)this->_vptr_Dropout_x86[-3]),
                         bottom_top_blob,opt);
      return iVar9;
    }
    iVar9 = bottom_top_blob->dims;
    uVar3 = bottom_top_blob->w;
    uVar4 = bottom_top_blob->h;
    uVar13 = bottom_top_blob->c;
    if (iVar9 == 3) {
      if (0 < (int)uVar13) {
        uVar10 = 1;
        if (1 < (int)uVar13) {
          uVar10 = (ulong)uVar13;
        }
        uVar8 = 0;
        do {
          if (0 < (int)(uVar4 * uVar3)) {
            pfVar12 = (float *)(bottom_top_blob->cstep * uVar8 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar9 = uVar4 * uVar3;
            do {
              *pfVar12 = *pfVar12 * fVar2;
              pfVar12[1] = pfVar12[1] * fVar2;
              pfVar12[2] = pfVar12[2] * fVar2;
              pfVar12[3] = pfVar12[3] * fVar2;
              pfVar12 = pfVar12 + 4;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar10);
      }
    }
    else if (iVar9 == 2) {
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          if (0 < (int)uVar3) {
            pfVar12 = (float *)((long)bottom_top_blob->w * uVar10 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            uVar8 = (ulong)uVar3;
            do {
              *pfVar12 = *pfVar12 * fVar2;
              pfVar12[1] = pfVar12[1] * fVar2;
              pfVar12[2] = pfVar12[2] * fVar2;
              pfVar12[3] = pfVar12[3] * fVar2;
              pfVar12 = pfVar12 + 4;
              uVar13 = (int)uVar8 - 1;
              uVar8 = (ulong)uVar13;
            } while (uVar13 != 0);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
    }
    else if ((iVar9 == 1) && (0 < (int)uVar3)) {
      lVar11 = 0;
      do {
        pfVar12 = (float *)((long)bottom_top_blob->data + lVar11);
        fVar5 = pfVar12[1];
        fVar6 = pfVar12[2];
        fVar7 = pfVar12[3];
        pfVar1 = (float *)((long)bottom_top_blob->data + lVar11);
        *pfVar1 = *pfVar12 * fVar2;
        pfVar1[1] = fVar5 * fVar2;
        pfVar1[2] = fVar6 * fVar2;
        pfVar1[3] = fVar7 * fVar2;
        lVar11 = lVar11 + 0x10;
      } while ((ulong)uVar3 << 4 != lVar11);
    }
  }
  return 0;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}